

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O1

Values * __thiscall
Executor::loadInitial(Values *__return_storage_ptr__,Executor *this,uint numberOfUnits)

{
  ostream *poVar1;
  runtime_error *this_00;
  uint i;
  uint uVar2;
  ulong uVar3;
  allocator_type local_39;
  Executor *local_38;
  ulong uVar4;
  
  local_38 = this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,(ulong)numberOfUnits,&local_39);
  uVar2 = 0;
  do {
    if (numberOfUnits == uVar2) {
      return __return_storage_ptr__;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Insert initial state of ",0x18);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,". unit:\n> ",10);
    std::istream::_M_extract<unsigned_int>((uint *)&std::cin);
    uVar3 = (ulong)uVar2;
    uVar4 = (ulong)uVar2;
    uVar2 = uVar2 + 1;
  } while ((__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
           ._M_impl.super__Vector_impl_data._M_start[uVar3] <=
           (local_38->m_sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar4]);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Initial value is bigger than units size.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Values Executor::loadInitial(const unsigned int numberOfUnits) const
{
    Values initial(numberOfUnits);

    for (unsigned int i = 0; i < numberOfUnits; i++)
    {
        std::cout << "Insert initial state of " << (i + 1) << ". unit:\n> ";
        std::cin >> initial[i];
        if (initial[i] > m_sizes[i])
            throw std::runtime_error("Initial value is bigger than units size.");
    }

    return initial;
}